

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> __thiscall
duckdb::WriteAheadLog::ReplayInternal
          (WriteAheadLog *this,AttachedDatabase *database,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pFVar4;
  FileSystem *fs;
  type pCVar5;
  MetaTransaction *pMVar6;
  StorageManager *pSVar7;
  int local_484;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_480 [3];
  idx_t successful_offset;
  Connection con;
  ReplayState state;
  string wal_path;
  BufferedFileReader reader;
  ReplayState checkpoint_state;
  WALInitState init_state;
  
  Connection::Connection(&con,database->db);
  pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (handle);
  ::std::__cxx11::string::string((string *)&wal_path,(string *)&pFVar4->path);
  fs = FileSystem::Get(database);
  local_480[0]._M_head_impl =
       (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t
       .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  BufferedFileReader::BufferedFileReader
            (&reader,fs,
             (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             local_480);
  if (local_480[0]._M_head_impl != (FileHandle *)0x0) {
    (*(local_480[0]._M_head_impl)->_vptr_FileHandle[1])();
  }
  local_480[0]._M_head_impl = (FileHandle *)0x0;
  bVar1 = BufferedFileReader::Finished(&reader);
  if (!bVar1) {
    Connection::BeginTransaction(&con);
    pCVar5 = shared_ptr<duckdb::ClientContext,_true>::operator*(&con.context);
    pMVar6 = MetaTransaction::Get(pCVar5);
    MetaTransaction::ModifyDatabase(pMVar6,database);
    DBConfig::GetConfig(database->db);
    checkpoint_state.context = shared_ptr<duckdb::ClientContext,_true>::operator*(&con.context);
    checkpoint_state.db = database;
    checkpoint_state.catalog = AttachedDatabase::GetCatalog(database);
    checkpoint_state.current_table.ptr = (TableCatalogEntry *)0x0;
    checkpoint_state.checkpoint_id.block_pointer = 0xffffffffffffffff;
    checkpoint_state.checkpoint_id.offset = 0;
    checkpoint_state.checkpoint_id.unused_padding = 0;
    checkpoint_state.wal_version = 1;
    do {
      WriteAheadLogDeserializer::Open
                ((WriteAheadLogDeserializer *)&init_state,&checkpoint_state,&reader,true);
      bVar1 = WriteAheadLogDeserializer::ReplayEntry((WriteAheadLogDeserializer *)&init_state);
      if (bVar1) {
        bVar1 = BufferedFileReader::Finished(&reader);
        if (bVar1) goto LAB_01ad769a;
      }
      WriteAheadLogDeserializer::~WriteAheadLogDeserializer
                ((WriteAheadLogDeserializer *)&init_state);
    } while( true );
  }
LAB_01ad76d7:
  this->_vptr_WriteAheadLog = (_func_int **)0x0;
LAB_01ad781e:
  BufferedFileReader::~BufferedFileReader(&reader);
  ::std::__cxx11::string::~string((string *)&wal_path);
  Connection::~Connection(&con);
  return (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)
         (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)this;
LAB_01ad769a:
  WriteAheadLogDeserializer::~WriteAheadLogDeserializer((WriteAheadLogDeserializer *)&init_state);
  if (checkpoint_state.checkpoint_id.block_pointer != 0xffffffffffffffff) {
    pSVar7 = AttachedDatabase::GetStorageManager(database);
    iVar3 = (*pSVar7->_vptr_StorageManager[4])
                      (pSVar7,checkpoint_state.checkpoint_id.block_pointer,
                       CONCAT44(checkpoint_state.checkpoint_id.unused_padding,
                                checkpoint_state.checkpoint_id.offset));
    if ((char)iVar3 != '\0') goto LAB_01ad76d7;
  }
  state.context = shared_ptr<duckdb::ClientContext,_true>::operator*(&con.context);
  state.db = database;
  state.catalog = AttachedDatabase::GetCatalog(database);
  state.current_table.ptr = (TableCatalogEntry *)0x0;
  state.checkpoint_id.block_pointer = 0xffffffffffffffff;
  state.checkpoint_id.offset = 0;
  state.checkpoint_id.unused_padding = 0;
  state.wal_version = 1;
  BufferedFileReader::Reset(&reader);
  successful_offset = 0;
  local_484 = 0;
  do {
    WriteAheadLogDeserializer::Open((WriteAheadLogDeserializer *)&init_state,&state,&reader,false);
    bVar2 = WriteAheadLogDeserializer::ReplayEntry((WriteAheadLogDeserializer *)&init_state);
    bVar1 = true;
    if (bVar2) {
      Connection::Commit(&con);
      successful_offset = reader.offset;
      bVar1 = BufferedFileReader::Finished(&reader);
      if (bVar1) {
        local_484 = 1;
        bVar1 = false;
      }
      else {
        Connection::BeginTransaction(&con);
        pCVar5 = shared_ptr<duckdb::ClientContext,_true>::operator*(&con.context);
        pMVar6 = MetaTransaction::Get(pCVar5);
        bVar1 = true;
        MetaTransaction::ModifyDatabase(pMVar6,database);
      }
    }
    WriteAheadLogDeserializer::~WriteAheadLogDeserializer((WriteAheadLogDeserializer *)&init_state);
  } while (bVar1);
  init_state = UNINITIALIZED_REQUIRES_TRUNCATE - local_484;
  make_uniq<duckdb::WriteAheadLog,duckdb::AttachedDatabase&,std::__cxx11::string&,unsigned_long&,duckdb::WALInitState&>
            ((duckdb *)this,database,&wal_path,&successful_offset,&init_state);
  goto LAB_01ad781e;
}

Assistant:

unique_ptr<WriteAheadLog> WriteAheadLog::ReplayInternal(AttachedDatabase &database, unique_ptr<FileHandle> handle) {
	Connection con(database.GetDatabase());
	auto wal_path = handle->GetPath();
	BufferedFileReader reader(FileSystem::Get(database), std::move(handle));
	if (reader.Finished()) {
		// WAL file exists but it is empty - we can delete the file
		return nullptr;
	}

	con.BeginTransaction();
	MetaTransaction::Get(*con.context).ModifyDatabase(database);

	auto &config = DBConfig::GetConfig(database.GetDatabase());
	// first deserialize the WAL to look for a checkpoint flag
	// if there is a checkpoint flag, we might have already flushed the contents of the WAL to disk
	ReplayState checkpoint_state(database, *con.context);
	try {
		while (true) {
			// read the current entry (deserialize only)
			auto deserializer = WriteAheadLogDeserializer::Open(checkpoint_state, reader, true);
			if (deserializer.ReplayEntry()) {
				// check if the file is exhausted
				if (reader.Finished()) {
					// we finished reading the file: break
					break;
				}
			}
		}
	} catch (std::exception &ex) { // LCOV_EXCL_START
		ErrorData error(ex);
		// ignore serialization exceptions - they signal a torn WAL
		if (error.Type() != ExceptionType::SERIALIZATION) {
			error.Throw("Failure while replaying WAL file \"" + wal_path + "\": ");
		}
	} // LCOV_EXCL_STOP
	if (checkpoint_state.checkpoint_id.IsValid()) {
		// there is a checkpoint flag: check if we need to deserialize the WAL
		auto &manager = database.GetStorageManager();
		if (manager.IsCheckpointClean(checkpoint_state.checkpoint_id)) {
			// the contents of the WAL have already been checkpointed
			// we can safely truncate the WAL and ignore its contents
			return nullptr;
		}
	}

	// we need to recover from the WAL: actually set up the replay state
	ReplayState state(database, *con.context);

	// reset the reader - we are going to read the WAL from the beginning again
	reader.Reset();

	// replay the WAL
	// note that everything is wrapped inside a try/catch block here
	// there can be errors in WAL replay because of a corrupt WAL file
	idx_t successful_offset = 0;
	bool all_succeeded = false;
	try {
		while (true) {
			// read the current entry
			auto deserializer = WriteAheadLogDeserializer::Open(state, reader);
			if (deserializer.ReplayEntry()) {
				con.Commit();
				successful_offset = reader.offset;
				// check if the file is exhausted
				if (reader.Finished()) {
					// we finished reading the file: break
					all_succeeded = true;
					break;
				}
				con.BeginTransaction();
				MetaTransaction::Get(*con.context).ModifyDatabase(database);
			}
		}
	} catch (std::exception &ex) { // LCOV_EXCL_START
		// exception thrown in WAL replay: rollback
		con.Query("ROLLBACK");
		ErrorData error(ex);
		// serialization failure means a truncated WAL
		// these failures are ignored unless abort_on_wal_failure is true
		// other failures always result in an error
		if (config.options.abort_on_wal_failure || error.Type() != ExceptionType::SERIALIZATION) {
			error.Throw("Failure while replaying WAL file \"" + wal_path + "\": ");
		}
	} catch (...) {
		// exception thrown in WAL replay: rollback
		con.Query("ROLLBACK");
		throw;
	} // LCOV_EXCL_STOP
	auto init_state = all_succeeded ? WALInitState::UNINITIALIZED : WALInitState::UNINITIALIZED_REQUIRES_TRUNCATE;
	return make_uniq<WriteAheadLog>(database, wal_path, successful_offset, init_state);
}